

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O0

char * anon_unknown.dwarf_51674::readlink_strdup(char *path)

{
  int iVar1;
  ssize_t sVar2;
  char *pcStack_20;
  int rc;
  char *retval;
  int sz;
  char *path_local;
  
  retval._4_4_ = 0x400;
  pcStack_20 = (char *)0x0;
  while( true ) {
    if (0x3ffffffe < retval._4_4_) {
      operator_delete(pcStack_20);
      return (char *)0x0;
    }
    retval._4_4_ = retval._4_4_ << 1;
    pcStack_20 = (char *)tc_realloc(pcStack_20,(long)retval._4_4_);
    sVar2 = readlink(path,pcStack_20,(long)retval._4_4_);
    iVar1 = (int)sVar2;
    if (iVar1 < 0) break;
    if (iVar1 < retval._4_4_) {
      pcStack_20[iVar1] = '\0';
      return pcStack_20;
    }
  }
  perror("GetProgramInvocationName:readlink");
  operator_delete(pcStack_20);
  return (char *)0x0;
}

Assistant:

inline // NOTE: inline makes us avoid unused function warning
const char* readlink_strdup(const char* path) {
  int sz = 1024;
  char* retval = nullptr;
  for (;;) {
    if (INT_MAX / 2 <= sz) {
      free(retval);
      retval = nullptr;
      break;
    }
    sz *= 2;
    retval = static_cast<char*>(realloc(retval, sz));
    int rc = readlink(path, retval, sz);
    if (rc < 0) {
      perror("GetProgramInvocationName:readlink");
      free(retval);
      retval = nullptr;
      break;
    }
    if (rc < sz) {
      retval[rc] = 0;
      break;
    }
    // repeat if readlink may have truncated it's output
  }
  return retval;
}